

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

void Gia_ManSimPatValuesDerive(Gia_Man_t *p,int nWords,Vec_Wrd_t *vSims,Vec_Wrd_t *vValues)

{
  int iVar1;
  Gia_Obj_t *pObj;
  word *__dest;
  word *__src;
  int v;
  int i;
  
  if (vSims->nSize != p->nObjs * nWords) {
    __assert_fail("Vec_WrdSize(vSims) == nWords * Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0xe5,"void Gia_ManSimPatValuesDerive(Gia_Man_t *, int, Vec_Wrd_t *, Vec_Wrd_t *)"
                 );
  }
  iVar1 = p->vCos->nSize;
  if (vValues->nSize == iVar1 * nWords) {
    i = 0;
    v = 0;
    while( true ) {
      if (iVar1 <= v) {
        return;
      }
      pObj = Gia_ManCo(p,v);
      iVar1 = Gia_ObjId(p,pObj);
      if (iVar1 == 0) break;
      __dest = Vec_WrdEntryP(vValues,i);
      __src = Vec_WrdEntryP(vSims,iVar1 * nWords);
      memcpy(__dest,__src,(long)nWords << 3);
      v = v + 1;
      iVar1 = p->vCos->nSize;
      i = i + nWords;
    }
    return;
  }
  __assert_fail("Vec_WrdSize(vValues) == nWords * Gia_ManCoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                ,0xe6,"void Gia_ManSimPatValuesDerive(Gia_Man_t *, int, Vec_Wrd_t *, Vec_Wrd_t *)");
}

Assistant:

void Gia_ManSimPatValuesDerive( Gia_Man_t * p, int nWords, Vec_Wrd_t * vSims, Vec_Wrd_t * vValues )
{
    int i, Id;
    assert( Vec_WrdSize(vSims)   == nWords * Gia_ManObjNum(p) );
    assert( Vec_WrdSize(vValues) == nWords * Gia_ManCoNum(p)  );
    Gia_ManForEachCoId( p, Id, i )
        memcpy( Vec_WrdEntryP(vValues, nWords * i), Vec_WrdEntryP(vSims, nWords * Id), sizeof(word)* nWords );
}